

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Function * __thiscall wasm::Module::addFunction(Module *this,Function *curr)

{
  Function *pFVar1;
  allocator<char> local_39;
  string local_38;
  Function *local_18;
  Function *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"addFunction",&local_39);
  pFVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>,std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>,wasm::Function>
                     (&this->functions,&this->functionsMap,curr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return pFVar1;
}

Assistant:

Function* Module::addFunction(Function* curr) {
  return addModuleElement(functions, functionsMap, curr, "addFunction");
}